

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

int onmt::unicode::get_script_code(char *script_name)

{
  bool bVar1;
  int iVar2;
  char *in_RDI;
  pair<const_char_*,_int> *script_info;
  pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *pair;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
  *__range2;
  reference in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
  local_20;
  undefined1 *local_18;
  char *local_10;
  
  local_18 = compat_scripts;
  local_10 = in_RDI;
  local_20._M_current =
       (pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *)
       std::
       vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
       ::begin((vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
                *)in_stack_ffffffffffffffc8);
  std::
  vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
  ::end((vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
         *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      iVar2 = u_getPropertyValueEnum_70(0x100a,local_10);
      return iVar2;
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
         ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffc8;
    iVar2 = strcmp(local_10,(in_stack_ffffffffffffffc8->first).first);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
    ::operator++(&local_20);
  }
  return (in_stack_ffffffffffffffc8->first).second;
}

Assistant:

int get_script_code(const char* script_name)
    {
      for (const auto& pair : compat_scripts)
      {
        const auto& script_info = pair.first;
        if (strcmp(script_name, script_info.first) == 0)
          return script_info.second;
      }

      return u_getPropertyValueEnum(UCHAR_SCRIPT, script_name);
    }